

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O2

void __thiscall
gmlc::containers::StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_>::
blockCheck(StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_> *this)

{
  Publication **__dest;
  Publication **ppPVar1;
  Publication *pPVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  
  if (0x1f < this->bsize) {
    iVar4 = this->dataSlotsAvailable;
    lVar5 = (long)iVar4;
    if (lVar5 == 0) {
      ppPVar1 = (Publication **)operator_new__(0x200);
      this->dataptr = ppPVar1;
      this->dataSlotsAvailable = 0x40;
      this->dataSlotIndex = -1;
    }
    else if (iVar4 + -1 <= this->dataSlotIndex) {
      uVar3 = 0xffffffffffffffff;
      if (-1 < iVar4) {
        uVar3 = lVar5 << 4;
      }
      __dest = (Publication **)operator_new__(uVar3);
      ppPVar1 = this->dataptr;
      memmove(__dest,ppPVar1,lVar5 << 3);
      if (ppPVar1 != (Publication **)0x0) {
        operator_delete__(ppPVar1);
        iVar4 = this->dataSlotsAvailable;
      }
      this->dataptr = __dest;
      this->dataSlotsAvailable = iVar4 * 2;
    }
    pPVar2 = getNewBlock(this);
    iVar4 = this->dataSlotIndex;
    this->dataSlotIndex = iVar4 + 1;
    this->dataptr[(long)iVar4 + 1] = pPVar2;
    this->bsize = 0;
  }
  return;
}

Assistant:

void blockCheck()
        {
            if (bsize >= static_cast<int>(blockSize)) {
                if (0 == dataSlotsAvailable) {
                    dataptr = new X*[64];
                    dataSlotsAvailable = 64;
                    dataSlotIndex = -1;
                } else if (dataSlotIndex >= dataSlotsAvailable - 1) {
                    auto mem =
                        new X*[static_cast<size_t>(dataSlotsAvailable) * 2];
                    std::copy(dataptr, dataptr + dataSlotsAvailable, mem);
                    delete[] dataptr;
                    dataptr = mem;
                    dataSlotsAvailable *= 2;
                }
                dataptr[++dataSlotIndex] = getNewBlock();
                bsize = 0;
            }
        }